

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               *this,raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                     *that,allocator_type *a)

{
  undefined1 uVar1;
  hasher *phVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *this_00;
  size_t sVar3;
  size_t *psVar4;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_RSI;
  long in_RDI;
  iterator iVar5;
  FindInfo FVar6;
  FindInfo target;
  size_t hashval;
  value_type *v;
  const_iterator __end0;
  const_iterator __begin0;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *__range3;
  pair<const_cs_impl::any,_cs::statement_block_*> *in_stack_fffffffffffffef8;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_ffffffffffffff00;
  size_t in_stack_ffffffffffffff08;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff30;
  undefined8 *puVar7;
  key_equal *in_stack_ffffffffffffff38;
  hasher *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *in_stack_ffffffffffffff50;
  anon_union_8_1_a8a14541_for_iterator_1 this_01;
  ctrl_t *local_a8;
  undefined8 local_68;
  size_t local_60;
  reference local_58;
  iterator local_50;
  iterator local_40;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *local_30;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
  *local_10;
  
  local_10 = in_RSI;
  hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
            *)0x1c4009);
  eq_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
          *)0x1c401e);
  raw_hash_set(in_stack_ffffffffffffff50,
               CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  capacity(local_10);
  rehash(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  local_30 = local_10;
  local_40 = (iterator)begin(in_stack_ffffffffffffff00);
  iVar5 = (iterator)end(in_stack_ffffffffffffff00);
  local_50 = iVar5;
  while( true ) {
    this_01 = iVar5.field_1;
    local_a8 = iVar5.ctrl_;
    uVar1 = priv::operator!=((const_iterator *)in_stack_ffffffffffffff00,
                             (const_iterator *)in_stack_fffffffffffffef8);
    if (!(bool)uVar1) break;
    local_58 = const_iterator::operator*((const_iterator *)0x1c4115);
    puVar7 = &local_68;
    phVar2 = hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                       *)0x1c4140);
    *puVar7 = phVar2;
    local_60 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,void>
               ::
               apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>::HashElement,std::pair<cs_impl::any_const,cs::statement_block*>const&,phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>>
                         ((HashElement *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    FVar6 = find_first_non_full((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                                 *)this_01.slot_,CONCAT17(uVar1,in_stack_ffffffffffffff48));
    this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
               *)FVar6.offset;
    H2(local_60);
    set_ctrl(this_00,in_stack_ffffffffffffff08,(ctrl_t)((ulong)in_stack_ffffffffffffff00 >> 0x38));
    raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,cs::statement_block*>,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<std::pair<cs_impl::any_const,cs::statement_block*>>>
    ::emplace_at<std::pair<cs_impl::any_const,cs::statement_block*>const&>
              (this_00,in_stack_ffffffffffffff08,
               (pair<const_cs_impl::any,_cs::statement_block_*> *)in_stack_ffffffffffffff00);
    HashtablezInfoHandle::RecordInsert
              ((HashtablezInfoHandle *)(in_RDI + 0x20),local_60,FVar6.probe_length);
    const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff00);
    iVar5.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)
         (anon_union_8_1_a8a14541_for_iterator_1)this_01.slot_;
    iVar5.ctrl_ = local_a8;
  }
  sVar3 = size(local_10);
  *(size_t *)(in_RDI + 0x10) = sVar3;
  sVar3 = size(local_10);
  psVar4 = growth_left((raw_hash_set<phmap::priv::FlatHashMapPolicy<cs_impl::any,_cs::statement_block_*>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<std::pair<const_cs_impl::any,_cs::statement_block_*>_>_>
                        *)0x1c4291);
  *psVar4 = *psVar4 - sVar3;
  return;
}

Assistant:

raw_hash_set(const raw_hash_set& that, const allocator_type& a)
				: raw_hash_set(0, that.hash_ref(), that.eq_ref(), a)
			{
				rehash(that.capacity());   // operator=() should preserve load_factor
				// Because the table is guaranteed to be empty, we can do something faster
				// than a full `insert`.
				for (const auto& v : that) {
					const size_t hashval = PolicyTraits::apply(HashElement{hash_ref()}, v);
					auto target = find_first_non_full(hashval);
					set_ctrl(target.offset, H2(hashval));
					emplace_at(target.offset, v);
					infoz_.RecordInsert(hashval, target.probe_length);
				}
				size_ = that.size();
				growth_left() -= that.size();
			}